

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O2

void obuf_destroy(obuf *buf)

{
  iovec *piVar1;
  long lVar2;
  
  piVar1 = buf->iov;
  for (lVar2 = 0; lVar2 < buf->n_iov; lVar2 = lVar2 + 1) {
    slab_put(buf->slabc,(slab *)((long)piVar1->iov_base + -0x30));
    piVar1 = piVar1 + 1;
  }
  memset(buf,0,0x328);
  return;
}

Assistant:

void
obuf_destroy(struct obuf *buf)
{
	int i;
	for (i = 0; i < buf->n_iov; i++) {
		struct slab *slab = slab_from_data(buf->iov[i].iov_base);
		slab_put(buf->slabc, slab);
	}
	/* Safety and also makes obuf_is_initialized work. */
	memset(buf, 0, sizeof(*buf));
}